

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

TCGv_i64 read_cpu_reg_aarch64(DisasContext_conflict1 *s,int reg,int sf)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 v;
  TCGContext_conflict1 *tcg_ctx;
  int sf_local;
  int reg_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = new_tmp_a64_aarch64(s);
  if (reg == 0x1f) {
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,0);
  }
  else if (sf == 0) {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_X[reg]);
  }
  else {
    tcg_gen_mov_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_X[reg]);
  }
  return ret;
}

Assistant:

TCGv_i64 read_cpu_reg(DisasContext *s, int reg, int sf)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 v = new_tmp_a64(s);
    if (reg != 31) {
        if (sf) {
            tcg_gen_mov_i64(tcg_ctx, v, tcg_ctx->cpu_X[reg]);
        } else {
            tcg_gen_ext32u_i64(tcg_ctx, v, tcg_ctx->cpu_X[reg]);
        }
    } else {
        tcg_gen_movi_i64(tcg_ctx, v, 0);
    }
    return v;
}